

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this,TPZGeoElRefLess<pzgeom::TPZGeoQuad> *gel)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b9de0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b9a38,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b9738;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c3028;
  iVar1 = (gel->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1];
  iVar2 = (gel->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2];
  iVar3 = (gel->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3];
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] =
       (gel->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoQuad_016c2fa0;
  lVar4 = 0x78;
  do {
    *(undefined ***)((long)(&this->fGeo + -2) + lVar4) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
     lVar4 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
     lVar4 + -0x50) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x150);
  for (lVar4 = 0x68; lVar4 != 0x140; lVar4 = lVar4 + 0x18) {
    TPZGeoElSide::TPZGeoElSide
              (&thisside,
               (TPZGeoElSideIndex *)
               ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
               lVar4 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&gelside,(TPZGeoElSideIndex *)
                        ((long)(gel->fGeo).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
                               fNodeIndexes + lVar4 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&thisside,&gelside);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}